

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

bool __thiscall
choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::operator==
          (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *this,
          AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *other)

{
  int *piVar1;
  int *piVar2;
  MainType MVar3;
  RepeatedGroup *pRVar4;
  RepeatedGroup *pRVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  
  if (this->size == other->size) {
    bVar8 = this->size == 0;
    if (!bVar8) {
      pRVar5 = this->items;
      pRVar4 = other->items;
      if (pRVar5->repetitions == pRVar4->repetitions) {
        uVar6 = 0;
        lVar7 = 0x28;
        while (MVar3 = (pRVar5->elementType).mainType, MVar3 == (pRVar4->elementType).mainType) {
          if (MVar3 < complexArray) {
            if (MVar3 == vector) {
              bVar9 = (pRVar5->elementType).content.vector.numElements ==
                      (pRVar4->elementType).content.vector.numElements &&
                      (pRVar5->elementType).content.vector.elementType ==
                      (pRVar4->elementType).content.vector.elementType;
              goto LAB_001cfa3c;
            }
            if (MVar3 == primitiveArray) {
              if ((pRVar5->elementType).content.vector.elementType !=
                  (pRVar4->elementType).content.vector.elementType) {
                return bVar8;
              }
              if ((pRVar5->elementType).content.vector.numElements !=
                  (pRVar4->elementType).content.vector.numElements) {
                return bVar8;
              }
              bVar9 = (pRVar5->elementType).content.primitiveArray.numVectorElements ==
                      (pRVar4->elementType).content.primitiveArray.numVectorElements;
              goto LAB_001cfa3c;
            }
          }
          else {
            if (MVar3 == complexArray) {
              bVar9 = operator==((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                                 (pRVar5->elementType).content.object,
                                 (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                                 (pRVar4->elementType).content.object);
            }
            else {
              if (MVar3 != object) goto LAB_001cfa40;
              bVar9 = Object::operator==((pRVar5->elementType).content.object,
                                         (pRVar4->elementType).content.object);
            }
LAB_001cfa3c:
            if (bVar9 == false) {
              return bVar8;
            }
          }
LAB_001cfa40:
          uVar6 = uVar6 + 1;
          bVar8 = this->size <= uVar6;
          if (bVar8) {
            return bVar8;
          }
          piVar1 = (int *)((long)&this->items->repetitions + lVar7);
          pRVar5 = this->items + uVar6;
          pRVar4 = other->items + uVar6;
          piVar2 = (int *)((long)&other->items->repetitions + lVar7);
          lVar7 = lVar7 + 0x28;
          if (*piVar1 != *piVar2) {
            return bVar8;
          }
        }
      }
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool operator== (const AllocatedVector& other) const
    {
        if (size != other.size)
            return false;

        for (decltype (size) i = 0; i < size; ++i)
            if (! (items[i] == other.items[i]))
                return false;

        return true;
    }